

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::log_input_event(uint argc)

{
  CVmConsoleMain *this;
  int iVar1;
  int32_t evt;
  char *pcVar2;
  ushort *puVar3;
  size_t paramlen;
  vm_val_t *pvVar4;
  vm_val_t ele1;
  vm_val_t ele2;
  
  CVmBif::check_argc(argc,1);
  pvVar4 = sp_ + -1;
  iVar1 = vm_val_t::is_listlike(pvVar4);
  if (iVar1 == 0) {
    err_throw(0x900);
  }
  iVar1 = vm_val_t::ll_length(pvVar4);
  if (iVar1 < 1) goto LAB_0022932e;
  vm_val_t::ll_index(pvVar4,&ele1,1);
  paramlen = 0;
  puVar3 = (ushort *)0x0;
  if (iVar1 != 1) {
    vm_val_t::ll_index(pvVar4,&ele2,2);
    if (ele2.typ == VM_OBJ) {
      iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[ele2.val.obj >> 0xc][ele2.val.obj & 0xfff]
                                     .ptr_ + 8))
                        (G_obj_table_X.pages_[ele2.val.obj >> 0xc] + (ele2.val.obj & 0xfff),
                         CVmObjFileName::metaclass_reg_);
      if (iVar1 == 0) goto LAB_00229274;
      if (G_obj_table_X.pages_[ele2.val.obj >> 0xc] == (CVmObjPageEntry *)0x0) goto LAB_00229274;
      puVar3 = (ushort *)
               CVmObjFileName::get_path_string
                         ((CVmObjFileName *)
                          (G_obj_table_X.pages_[ele2.val.obj >> 0xc] + (ele2.val.obj & 0xfff)));
    }
    else {
LAB_00229274:
      puVar3 = (ushort *)vm_val_t::get_as_string(&ele2);
    }
    if (puVar3 == (ushort *)0x0) goto LAB_0022932e;
    paramlen = (size_t)*puVar3;
    puVar3 = puVar3 + 1;
  }
  iVar1 = vm_val_t::is_numeric(&ele1);
  this = G_console_X;
  if (iVar1 == 0) {
    pcVar2 = vm_val_t::get_as_string(&ele1);
    pvVar4 = sp_;
    if (pcVar2 == (char *)0x0) {
LAB_0022932e:
      err_throw(0x902);
    }
    sp_ = sp_ + 1;
    pvVar4->typ = ele1.typ;
    *(undefined4 *)&pvVar4->field_0x4 = ele1._4_4_;
    pvVar4->val = ele1.val;
    CVmBif::pop_str_val_ui((char *)&ele2,0x80);
    CVmConsole::log_event(&G_console_X->super_CVmConsole,(char *)&ele2,(char *)puVar3,paramlen,1);
  }
  else {
    evt = vm_val_t::num_to_int(&ele1);
    CVmConsole::log_event(&this->super_CVmConsole,evt,(char *)puVar3,paramlen,1);
  }
  sp_ = sp_ + -1;
  CVmBif::retval_nil();
  return;
}

Assistant:

void CVmBifTIO::log_input_event(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* retrieve the list */
    const vm_val_t *lst = G_stk->get(0);
    if (!lst->is_listlike(vmg0_))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* make sure we have at least one element */
    int len = lst->ll_length(vmg0_);
    if (len < 1)
        err_throw(VMERR_BAD_VAL_BIF);

    /* retrieve the event type code or tag name from the first element */
    vm_val_t ele1;
    lst->ll_index(vmg_ &ele1, 1);

    /* if there's a second element, retrieve the parameter string */
    const char *param = 0;
    size_t paramlen = 0;
    if (len >= 2)
    {
        /* there's a parameter - retrieve it */
        vm_val_t ele2;
        lst->ll_index(vmg_ &ele2, 2);

        /* 
         *   Get its string value.  If it's a filename object, use the
         *   filename path string. 
         */
        CVmObjFileName *fname_param = vm_val_cast(CVmObjFileName, &ele2);
        if (fname_param != 0)
            param = fname_param->get_path_string();
        else
            param = ele2.get_as_string(vmg0_);

        /* if we didn't get a parameter string value, it's an error */
        if (param == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* get the parameter length and buffer pointer */
        paramlen = vmb_get_len(param);
        param += VMB_LEN;
    }

    /* log the event, according to the type of the event code */
    if (ele1.is_numeric(vmg0_))
    {
        /* it's an integer event type code - log it */
        G_console->log_event(
            vmg_ ele1.num_to_int(vmg0_), param, paramlen, TRUE);
    }
    else if (ele1.get_as_string(vmg0_) != 0)
    {
        /* it's a string event tag - retrieve it in the UI character set */
        char tag[128];
        G_stk->push(&ele1);
        pop_str_val_ui(vmg_ tag, sizeof(tag));

        /* log the event with the given tag */
        G_console->log_event(vmg_ tag, param, paramlen, TRUE);
    }
    else
    {
        /* other types are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* discard arguments */
    G_stk->discard(1);

    /* no return value */
    retval_nil(vmg0_);
}